

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O3

ssize_t __thiscall
sc_core::vcd_unsigned_int_trace::write(vcd_unsigned_int_trace *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  ulong __n_00;
  char rawdata [1000];
  char compdata [1000];
  byte local_7f8 [1008];
  char local_408 [1008];
  
  uVar1 = *this->object;
  uVar3 = (this->super_vcd_trace).bit_width;
  __n_00 = (ulong)uVar3;
  if ((uVar1 & ~this->mask) == 0) {
    if (0 < (int)uVar3) {
      uVar3 = 1 << ((char)uVar3 - 1U & 0x1f);
      uVar2 = 0;
      do {
        local_7f8[uVar2] = (uVar1 & uVar3) == 0 ^ 0x31;
        uVar3 = uVar3 >> 1;
        uVar2 = uVar2 + 1;
      } while (__n_00 != uVar2);
      goto LAB_002091fd;
    }
  }
  else if (0 < (int)uVar3) {
    memset(local_7f8,0x78,__n_00);
    goto LAB_002091fd;
  }
  __n_00 = 0;
LAB_002091fd:
  local_7f8[__n_00] = 0;
  vcd_trace::compose_data_line(&this->super_vcd_trace,(char *)local_7f8,local_408);
  fputs(local_408,(FILE *)CONCAT44(in_register_00000034,__fd));
  uVar1 = *this->object;
  this->old_value = uVar1;
  return (ulong)uVar1;
}

Assistant:

void
vcd_unsigned_int_trace::write(FILE* f)
{
    char rawdata[1000];
    char compdata[1000];
    int bitindex;

    // Check for overflow
    if ((object & mask) != object) {
        for (bitindex = 0; bitindex < bit_width; bitindex++){
            rawdata[bitindex] = 'x';
        }
    }
    else {
        unsigned bit_mask = 1 << (bit_width-1);
        for (bitindex = 0; bitindex < bit_width; bitindex++) {
            rawdata[bitindex] = (object & bit_mask)? '1' : '0';
            bit_mask = bit_mask >> 1;
        }
    }
    rawdata[bitindex] = '\0';
    compose_data_line(rawdata, compdata);
    std::fputs(compdata, f);
    old_value = object;
}